

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CSLModels.cpp
# Opt level: O0

void __thiscall XPMP2::CSLObj::Unload(CSLObj *this)

{
  undefined8 uVar1;
  undefined8 uVar2;
  long in_RDI;
  string *psVar3;
  string *in_stack_ffffffffffffffc8;
  string local_28 [40];
  
  if (*(long *)(in_RDI + 0xa0) != 0) {
    XPLMUnloadObject(*(undefined8 *)(in_RDI + 0xa0));
    *(undefined8 *)(in_RDI + 0xa0) = 0;
    *(undefined4 *)(in_RDI + 0xa8) = 0;
    if (glob < 1) {
      uVar1 = std::__cxx11::string::c_str();
      psVar3 = local_28;
      StripXPSysDir(in_stack_ffffffffffffffc8);
      uVar2 = std::__cxx11::string::c_str();
      LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/CSLModels.cpp"
             ,0xf9,"Unload",logDEBUG,"Object %s / %s unloaded",uVar1,uVar2,psVar3);
      std::__cxx11::string::~string(local_28);
    }
  }
  return;
}

Assistant:

void CSLObj::Unload ()
{
    if (xpObj) {
        XPLMUnloadObject(xpObj);
        xpObj = NULL;
        xpObjState = OLS_UNAVAIL;
        LOG_MSG(logDEBUG, DEBUG_OBJ_UNLOADED, cslKey.c_str(), StripXPSysDir(path).c_str());
    }
}